

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O3

uint64_t __thiscall
BamTools::Internal::BamStandardIndex::LookupLinearOffset
          (BamStandardIndex *this,BaiReferenceSummary *refSummary,int *index)

{
  uint64_t linearOffset;
  int64_t linearOffsetFilePosition;
  uint64_t local_20;
  long local_18;
  
  local_18 = (long)*index * 8 + refSummary->FirstLinearOffsetFilePosition;
  Seek(this,&local_18,0);
  ReadLinearOffset(this,&local_20);
  return local_20;
}

Assistant:

uint64_t BamStandardIndex::LookupLinearOffset(const BaiReferenceSummary& refSummary,
                                              const int& index)
{

    // attempt seek to proper index file position
    const int64_t linearOffsetFilePosition = (int64_t)refSummary.FirstLinearOffsetFilePosition +
                                             index * BamStandardIndex::SIZEOF_LINEAROFFSET;
    Seek(linearOffsetFilePosition, SEEK_SET);

    // read linear offset from BAI file
    uint64_t linearOffset;
    ReadLinearOffset(linearOffset);
    return linearOffset;
}